

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O3

int32_t __thiscall Bitmap::getPixelIndex(Bitmap *this,int32_t pixel,int32_t xoff,int32_t yoff)

{
  uint uVar1;
  int32_t index;
  uint uVar2;
  int iVar3;
  
  if (this->orientation == Horizontally) {
    uVar2 = xoff + pixel;
    if ((int)uVar2 < 0) {
      return -1;
    }
    uVar1 = this->width;
    if (uVar2 / uVar1 != (uint)pixel / uVar1) {
      return -1;
    }
    iVar3 = uVar1 * yoff + uVar2;
  }
  else {
    if (pixel < yoff) {
      return -1;
    }
    uVar2 = this->width;
    if ((uint)(pixel - yoff) / uVar2 != (uint)pixel / uVar2) {
      return -1;
    }
    iVar3 = uVar2 * xoff + (pixel - yoff);
  }
  if ((-1 < iVar3) && (iVar3 < this->length)) {
    return iVar3;
  }
  return -1;
}

Assistant:

int32_t Bitmap::getPixelIndex(const int32_t pixel, const int32_t xoff, const int32_t yoff)
{
   int32_t index = pixel;
   if (orientation == Orientation::Horizontally)
   {
      index += xoff;
      if (index >= 0)
      {
         if ((index / this->width) == (pixel / this->width)) //stay in the same line (as pixel was)?
         {
            index += yoff * this->width;
            if ((index >= 0) && (index < this->length))
            {
               return index;
            }
         }
      }
   }
   else //Vertically
   {
      if (index >= yoff)
      {
         index -= yoff;
         if ((index / this->width) == (pixel / this->width)) //stay in the same line (as pixel was)?
         {
            index += xoff * this->width;
            if ((index >= 0) && (index < this->length))
            {
               return index;
            }
         }
      }
   }
   //otherwise: "label-overflow"
   return -1;
}